

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesOverclockGetDomainVFProperties
          (zes_overclock_handle_t hDomainHandle,zes_vf_property_t *pVFProperties)

{
  zes_pfnOverclockGetDomainVFProperties_t pfnGetDomainVFProperties;
  ze_result_t result;
  zes_vf_property_t *pVFProperties_local;
  zes_overclock_handle_t hDomainHandle_local;
  
  pfnGetDomainVFProperties._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cb38 != (code *)0x0) {
    pfnGetDomainVFProperties._4_4_ = (*DAT_0011cb38)(hDomainHandle,pVFProperties);
  }
  return pfnGetDomainVFProperties._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesOverclockGetDomainVFProperties(
        zes_overclock_handle_t hDomainHandle,           ///< [in] Handle for the component domain.
        zes_vf_property_t* pVFProperties                ///< [in,out] The VF min,max,step for a specified domain.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetDomainVFProperties = context.zesDdiTable.Overclock.pfnGetDomainVFProperties;
        if( nullptr != pfnGetDomainVFProperties )
        {
            result = pfnGetDomainVFProperties( hDomainHandle, pVFProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }